

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::SetObjectMarkedBit(LargeHeapBlock *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  Recycler *recycler;
  LargeObjectHeader *pHeader;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  pHeader = (LargeObjectHeader *)objectAddress;
  objectAddress_local = this;
  BVar3 = IsValidObject(this,objectAddress);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x33b,"(IsValidObject(objectAddress))","IsValidObject(objectAddress)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  recycler = (Recycler *)0x0;
  bVar2 = GetObjectHeader(this,pHeader,(LargeObjectHeader **)&recycler);
  if (bVar2) {
    HeapBlockMap64::SetMark(&this->heapInfo->recycler->heapBlockMap,pHeader);
  }
  return;
}

Assistant:

void
LargeHeapBlock::SetObjectMarkedBit(void* objectAddress)
{
    Assert(IsValidObject(objectAddress));

    LargeObjectHeader* pHeader = nullptr;

    if (GetObjectHeader(objectAddress, &pHeader))
    {
        Recycler* recycler = this->heapInfo->recycler;

        recycler->heapBlockMap.SetMark(objectAddress);
    }
}